

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

int If_DsdManPushInv_rec(If_DsdMan_t *p,int iLit,uchar *pPerm)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (-1 < iLit) {
    uVar6 = (ulong)(uint)iLit;
    do {
      if ((p->vObjs).nSize <= (int)(uVar6 >> 1)) goto LAB_00424b58;
      pvVar1 = (p->vObjs).pArray[uVar6 >> 1];
      uVar2 = *(uint *)((long)pvVar1 + 4) & 7;
      if (uVar2 == 4) {
        if (*(uint *)((long)pvVar1 + 4) < 0x8000000) {
          return 1;
        }
        uVar5 = 0;
        while( true ) {
          uVar2 = *(uint *)((long)pvVar1 + uVar5 * 4 + 8);
          uVar6 = (ulong)uVar2;
          if (uVar6 == 0) {
            return 1;
          }
          iVar3 = If_DsdManCheckInv_rec(p,uVar2);
          if (iVar3 != 0) break;
          if ((int)uVar2 < 0) goto LAB_00424b39;
          if ((p->vObjs).nSize <= (int)(uVar2 >> 1)) goto LAB_00424b58;
          pPerm = pPerm + (*(uint *)((long)(p->vObjs).pArray[uVar2 >> 1] + 4) >> 3 & 0x1f);
          uVar5 = uVar5 + 1;
          if (*(uint *)((long)pvVar1 + 4) >> 0x1b <= uVar5) {
            return 1;
          }
        }
      }
      else {
        if (uVar2 != 5) {
          if (uVar2 == 2) {
            *pPerm = *pPerm ^ 1;
            return 1;
          }
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                        ,0x5d5,"int If_DsdManPushInv_rec(If_DsdMan_t *, int, unsigned char *)");
        }
        iVar3 = If_DsdManCheckInv_rec(p,*(int *)((long)pvVar1 + 0xc));
        if ((iVar3 == 0) ||
           (iVar3 = If_DsdManCheckInv_rec(p,*(int *)((long)pvVar1 + 0x10)), iVar3 == 0)) {
          __assert_fail("If_DsdManCheckInv_rec(p, pObj->pFans[1]) && If_DsdManCheckInv_rec(p, pObj->pFans[2])"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                        ,0x5cf,"int If_DsdManPushInv_rec(If_DsdMan_t *, int, unsigned char *)");
        }
        if ((int)*(uint *)((long)pvVar1 + 8) < 0) break;
        uVar2 = *(uint *)((long)pvVar1 + 8) >> 1;
        if ((p->vObjs).nSize <= (int)uVar2) {
LAB_00424b58:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar2 = *(uint *)((long)(p->vObjs).pArray[uVar2] + 4);
        If_DsdManPushInv_rec(p,*(int *)((long)pvVar1 + 0xc),pPerm + (uVar2 >> 3 & 0x1f));
        if ((int)*(uint *)((long)pvVar1 + 0xc) < 0) break;
        uVar4 = *(uint *)((long)pvVar1 + 0xc) >> 1;
        if ((p->vObjs).nSize <= (int)uVar4) goto LAB_00424b58;
        pPerm = pPerm + (uVar2 >> 3 & 0x1f) +
                (*(uint *)((long)(p->vObjs).pArray[uVar4] + 4) >> 3 & 0x1f);
        uVar6 = (ulong)*(uint *)((long)pvVar1 + 0x10);
      }
    } while (-1 < (int)uVar6);
  }
LAB_00424b39:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x12f,"int Abc_Lit2Var(int)");
}

Assistant:

int If_DsdManPushInv_rec( If_DsdMan_t * p, int iLit, unsigned char * pPerm )
{
    If_DsdObj_t * pObj;
    int i, iFanin;
    pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iLit) );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
        pPerm[0] = (unsigned char)Abc_LitNot((int)pPerm[0]);
    else if ( If_DsdObjType(pObj) == IF_DSD_XOR )
    {
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            if ( If_DsdManCheckInv_rec(p, iFanin) )
            {
                If_DsdManPushInv_rec( p, iFanin, pPerm );
                break;
            }
            pPerm += If_DsdVecLitSuppSize(&p->vObjs, iFanin);
        }
    }
    else if ( If_DsdObjType(pObj) == IF_DSD_MUX )
    {
        assert( If_DsdManCheckInv_rec(p, pObj->pFans[1]) && If_DsdManCheckInv_rec(p, pObj->pFans[2]) );
        pPerm += If_DsdVecLitSuppSize(&p->vObjs, pObj->pFans[0]);
        If_DsdManPushInv_rec(p, pObj->pFans[1], pPerm);
        pPerm += If_DsdVecLitSuppSize(&p->vObjs, pObj->pFans[1]);
        If_DsdManPushInv_rec(p, pObj->pFans[2], pPerm);
    }
    else assert( 0 );
    return 1;
}